

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_id_func.h
# Opt level: O3

void __thiscall
flow_cutter::UnitFlow::
increase<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>>
          (UnitFlow *this,
          Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
          *graph,int a)

{
  unsigned_long *puVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  
  iVar6 = a + 0x1f;
  if (-1 < a) {
    iVar6 = a;
  }
  uVar5 = (ulong)(uint)((a % 0x20) * 2);
  puVar1 = (this->flow).data_.data_;
  uVar3 = (ulong)((uint)(puVar1[iVar6 >> 5] >> (uVar5 & 0x3f)) & 3);
  puVar1[iVar6 >> 5] = (uVar3 + 1 ^ uVar3) << (uVar5 & 0x3f) ^ puVar1[iVar6 >> 5];
  if (a < (graph->back_arc).original_arc_count * 2) {
    iVar6 = (((graph->back_arc).original_back_arc.ptr)->super_ArrayIDFunc<int>).data_[a / 2];
  }
  else {
    iVar6 = a / 2;
  }
  uVar4 = (a & 1U) + iVar6 * 2 ^ 1;
  uVar2 = uVar4 + 0x1f;
  if (-1 < (int)uVar4) {
    uVar2 = uVar4;
  }
  uVar5 = (ulong)(uint)(((int)uVar4 % 0x20) * 2);
  puVar1[(int)uVar2 >> 5] =
       ((ulong)((uint)(puVar1[(int)uVar2 >> 5] >> (uVar5 & 0x3f)) & 3) ^ 1 - uVar3) <<
       (uVar5 & 0x3f) ^ puVar1[(int)uVar2 >> 5];
  return;
}

Assistant:

std::uint64_t operator()(int id) const
    {
        assert(0 <= id && id < preimage_ && "id out of bounds");

        int index = id / entry_count_per_uint64;
        int offset = (id % entry_count_per_uint64) * bit_count;
        return (data_[index] >> offset) & entry_mask;
    }